

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O1

string * __thiscall
gl3cts::TextureSwizzle::SmokeTest::getVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,SmokeTest *this,testCase *test_case,bool is_tested_stage)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  undefined7 in_register_00000009;
  long lVar4;
  size_t position;
  size_t local_60;
  GLchar *local_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000009,is_tested_stage) == 0) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1a405d5);
  }
  else {
    prepareArguments_abi_cxx11_(&local_50,this,test_case);
    sVar1 = test_case->m_texture_access_index;
    sVar2 = test_case->m_source_texture_format_index;
    local_58 = *(GLchar **)(channels + test_case->m_channel_index * 8);
    sVar3 = test_case->m_source_texture_target_index;
    local_60 = 0;
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               0x1a4071b);
    lVar4 = sVar2 * 0x78;
    Utils::replaceToken("PREFIX",&local_60,*(GLchar **)(*(long *)(&DAT_021da0d8 + lVar4) + 8),
                        __return_storage_ptr__);
    Utils::replaceToken("SAMPLER_TYPE",&local_60,*(GLchar **)(texture_targets + sVar3 * 0x30 + 0x18)
                        ,__return_storage_ptr__);
    Utils::replaceToken("BASIC_TYPE",&local_60,(GLchar *)**(undefined8 **)(&DAT_021da0d8 + lVar4),
                        __return_storage_ptr__);
    Utils::replaceToken("TEXTURE_ACCESS",&local_60,*(GLchar **)(texture_access + sVar1 * 0x18),
                        __return_storage_ptr__);
    Utils::replaceToken("ARGUMENTS",&local_60,local_50._M_dataplus._M_p,__return_storage_ptr__);
    Utils::replaceToken("CHANNEL",&local_60,local_58,__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SmokeTest::getVertexShader(const testCase& test_case, bool is_tested_stage)
{
	static const glw::GLchar* vs_blank_template = "#version 330 core\n"
												  "\n"
												  "void main()\n"
												  "{\n"
												  "    switch (gl_VertexID)\n"
												  "    {\n"
												  "      case 0: gl_Position = vec4(-1.0, 1.0, 0.0, 1.0); break; \n"
												  "      case 1: gl_Position = vec4( 1.0, 1.0, 0.0, 1.0); break; \n"
												  "      case 2: gl_Position = vec4(-1.0,-1.0, 0.0, 1.0); break; \n"
												  "      case 3: gl_Position = vec4( 1.0,-1.0, 0.0, 1.0); break; \n"
												  "    }\n"
												  "}\n"
												  "\n";

	static const glw::GLchar* vs_test_template = "#version 330 core\n"
												 "\n"
												 "uniform PREFIXsamplerSAMPLER_TYPE sampler;\n"
												 "\n"
												 "flat out BASIC_TYPE result;\n"
												 "\n"
												 "void main()\n"
												 "{\n"
												 "    result = TEXTURE_ACCESS(sampler, ARGUMENTS).CHANNEL;\n"
												 "\n"
												 "    switch (gl_VertexID)\n"
												 "    {\n"
												 "      case 0: gl_Position = vec4(-1.0, 1.0, 0.0, 1.0); break; \n"
												 "      case 1: gl_Position = vec4( 1.0, 1.0, 0.0, 1.0); break; \n"
												 "      case 2: gl_Position = vec4(-1.0,-1.0, 0.0, 1.0); break; \n"
												 "      case 3: gl_Position = vec4( 1.0,-1.0, 0.0, 1.0); break; \n"
												 "    }\n"
												 "}\n"
												 "\n";

	std::string vs;

	if (is_tested_stage)
	{
		/* */
		const std::string&	 arguments	 = prepareArguments(test_case);
		const _texture_access& access		 = texture_access[test_case.m_texture_access_index];
		const glw::GLchar*	 channel		 = channels[test_case.m_channel_index];
		const _texture_format& source_format = texture_formats[test_case.m_source_texture_format_index];
		const _texture_target& target		 = texture_targets[test_case.m_source_texture_target_index];

		size_t position = 0;

		vs = vs_test_template;

		Utils::replaceToken("PREFIX", position, source_format.m_sampler.m_sampler_prefix, vs);
		Utils::replaceToken("SAMPLER_TYPE", position, target.m_sampler_type, vs);
		Utils::replaceToken("BASIC_TYPE", position, source_format.m_sampler.m_basic_type, vs);
		Utils::replaceToken("TEXTURE_ACCESS", position, access.m_name, vs);
		Utils::replaceToken("ARGUMENTS", position, arguments.c_str(), vs);
		Utils::replaceToken("CHANNEL", position, channel, vs);
	}
	else
	{
		vs = vs_blank_template;
	}

	return vs;
}